

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImage.hpp
# Opt level: O2

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::NIB>::DiskImageHolder<std::__cxx11::string_const&>
          (DiskImageHolder<Storage::Disk::NIB> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  DiskImageHolderBase::DiskImageHolderBase(&this->super_DiskImageHolderBase);
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolder_0057b5e8;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_0057b648;
  NIB::NIB(&this->disk_image_,args);
  return;
}

Assistant:

DiskImageHolder(Ts&&... args) :
			disk_image_(args...) {}